

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  bool local_25;
  uint local_24;
  int x;
  int res;
  int n;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _res = argv;
  argv_local._0_4_ = argc;
  do {
    printf("Enter a number from 2 to 10: ");
    iVar1 = __isoc99_scanf("%d",&x);
    if (iVar1 == 1) {
      if ((x < 2) || (10 < x)) {
        printf("The number must be between 2 and 10.\n");
      }
    }
    else {
      if (iVar1 == -1) {
        printf("\n");
        return 0;
      }
      printf("Please enter a valid number.\n");
      __isoc99_scanf("%*[^\n]");
    }
    local_25 = x < 2 || 10 < x;
  } while (local_25);
  for (local_24 = 1; (int)local_24 < 0xb; local_24 = local_24 + 1) {
    printf("%d * %d = %d\n",(ulong)(uint)x,(ulong)local_24,(ulong)(x * local_24));
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int n;
  do {
    printf("Enter a number from 2 to 10: ");
    const int res = scanf("%d", &n);

    if (res == 1) {
      if (n < 2 || n > 10) printf("The number must be between 2 and 10.\n");
    } else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      printf("Please enter a valid number.\n");
      scanf("%*[^\n]"); // "swallows" any non-10 character, as to clear the input buffer
    }
  } while (n < 2 || n > 10);

  for (int x = 1; x <= 10; x++) {
    printf("%d * %d = %d\n", n, x, n * x);
  }

  return 0;
}